

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O1

void av1_ml_early_term_after_split
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,int64_t best_rd,
               int64_t part_none_rd,int64_t part_split_rd,int64_t *split_block_rd,
               PartitionSearchState *part_state)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _Bool _Var5;
  int16_t iVar6;
  long lVar7;
  ExtPartController *ext_part_controller;
  float *pfVar8;
  float *pfVar9;
  BLOCK_SIZE bsize;
  NN_CONFIG *pNVar10;
  bool bVar11;
  byte bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined4 uVar16;
  int in_stack_ffffffffffffd3c8;
  float local_2c2c;
  float features [31];
  int min_bh;
  float local_2a44 [628];
  float score;
  int local_68;
  
  bVar12 = 0;
  if (best_rd + 0x8000000000000001U < 0x8000000000000002) {
    return;
  }
  if (part_state->terminate_partition_search != 0) {
    return;
  }
  bsize = (part_state->part_blk_params).bsize;
  iVar2 = (cpi->common).width;
  iVar3 = (cpi->common).height;
  if (iVar2 < iVar3) {
    iVar3 = iVar2;
  }
  bVar11 = true;
  fVar13 = -1e+06;
  pNVar10 = (NN_CONFIG *)0x0;
  switch(bsize) {
  case BLOCK_8X8:
    fVar13 = *(float *)(&DAT_004fe5d8 + (ulong)(0x1df < iVar3) * 4);
    pNVar10 = &av1_early_term_after_split_nnconfig_8;
    break;
  default:
    goto switchD_001edb13_caseD_4;
  case BLOCK_16X16:
    fVar13 = *(float *)(&DAT_004fe5c0 + (ulong)(0x1df < iVar3) * 4);
    pNVar10 = &av1_early_term_after_split_nnconfig_16;
    break;
  case BLOCK_32X32:
    fVar13 = *(float *)(&DAT_004fe5c8 + (ulong)(0x1df < iVar3) * 4);
    pNVar10 = &av1_early_term_after_split_nnconfig_32;
    break;
  case BLOCK_64X64:
    fVar13 = *(float *)(&DAT_004fe5d0 + (ulong)(0x1df < iVar3) * 4);
    pNVar10 = &av1_early_term_after_split_nnconfig_64;
  }
  bVar11 = false;
switchD_001edb13_caseD_4:
  if (!bVar11) {
    iVar2 = (part_state->part_blk_params).mi_row;
    iVar3 = (part_state->part_blk_params).mi_col;
    iVar4 = (cpi->sf).part_sf.ml_early_term_after_part_split_level;
    lVar7 = 0;
    iVar6 = av1_dc_quant_QTX(x->qindex,0,(x->e_mbd).bd);
    features[0x1c] = 0.0;
    features[0x1d] = 0.0;
    features[0x1e] = 0.0;
    features[0x18] = 0.0;
    features[0x19] = 0.0;
    features[0x1a] = 0.0;
    features[0x1b] = 0.0;
    features[0x14] = 0.0;
    features[0x15] = 0.0;
    features[0x16] = 0.0;
    features[0x17] = 0.0;
    features[0x10] = 0.0;
    features[0x11] = 0.0;
    features[0x12] = 0.0;
    features[0x13] = 0.0;
    features[0xc] = 0.0;
    features[0xd] = 0.0;
    features[0xe] = 0.0;
    features[0xf] = 0.0;
    features[8] = 0.0;
    features[9] = 0.0;
    features[10] = 0.0;
    features[0xb] = 0.0;
    features[4] = 0.0;
    features[5] = 0.0;
    features[6] = 0.0;
    features[7] = 0.0;
    features[0] = 0.0;
    features[1] = 0.0;
    features[2] = 0.0;
    features[3] = 0.0;
    bVar1 = block_size_wide[bsize];
    fVar14 = log1pf((float)((int)iVar6 >> ((char)(x->e_mbd).bd - 8U & 0x1f)) * 0.25);
    features[0] = fVar14;
    fVar14 = (float)best_rd;
    fVar15 = log1pf(((fVar14 / (float)bVar1) / (float)bVar1) * 0.0009765625);
    features[1] = fVar15;
    bVar11 = part_none_rd - 1U < 0x7ffffffffffffffe;
    if (bVar11) {
      features[3] = (float)part_none_rd / fVar14;
    }
    else {
      features[3] = 1.0;
    }
    features[4] = 0.0;
    features[2] = 1.0;
    if (!bVar11) {
      features[2] = 0.0;
    }
    if (part_split_rd - 1U < 0x7ffffffffffffffe) {
      features[5] = (float)part_split_rd / fVar14;
      features[4] = 1.0;
    }
    else {
      features[5] = 1.0;
    }
    do {
      bVar11 = *(long *)((long)split_block_rd + lVar7) - 1U < 0x7ffffffffffffffe;
      if (bVar11) {
        fVar15 = (float)*(long *)((long)split_block_rd + lVar7) / fVar14;
      }
      else {
        fVar15 = 1.0;
      }
      uVar16 = 0x3f800000;
      if (!bVar11) {
        uVar16 = 0;
      }
      *(undefined4 *)((long)features + lVar7 * 2 + 0x18) = uVar16;
      *(float *)((long)features + lVar7 * 2 + 0x1c) = fVar15;
      score = 9.80909e-45;
      min_bh = 7;
      get_min_bsize(*(SIMPLE_MOTION_DATA_TREE **)((long)sms_tree->split + lVar7),(int *)&score,
                    &min_bh);
      *(ulong *)((long)features + lVar7 * 2 + 0x20) = CONCAT44((float)min_bh,(float)(int)score);
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x20);
    local_2c2c = fVar13 + -0.3;
    if (1 < iVar4) {
      local_2c2c = fVar13;
    }
    simple_motion_search_prune_part_features(cpi,x,sms_tree,iVar2,iVar3,bsize,(float *)0x0,7);
    fVar13 = log1pf((float)sms_tree->sms_none_feat[1]);
    features[0x16] = fVar13;
    fVar13 = log1pf((float)sms_tree->split[0]->sms_none_feat[1]);
    features[0x17] = fVar13;
    fVar13 = log1pf((float)sms_tree->split[1]->sms_none_feat[1]);
    features[0x18] = fVar13;
    fVar13 = log1pf((float)sms_tree->split[2]->sms_none_feat[1]);
    features[0x19] = fVar13;
    features[0x1a] = log1pf((float)sms_tree->split[3]->sms_none_feat[1]);
    features[0x1b] = log1pf((float)sms_tree->sms_rect_feat[1]);
    features[0x1c] = log1pf((float)sms_tree->sms_rect_feat[3]);
    fVar13 = log1pf((float)sms_tree->sms_rect_feat[5]);
    features[0x1d] = fVar13;
    fVar13 = log1pf((float)sms_tree->sms_rect_feat[7]);
    features[0x1e] = fVar13;
    write_features_to_file
              ((cpi->oxcf).partition_info_path,(cpi->ext_part_controller).test_mode != 0,features,
               0x1f,4,bsize,in_stack_ffffffffffffd3c8,(int)fVar14);
    if ((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
       (ext_part_controller = &cpi->ext_part_controller, ext_part_controller->ready != 0)) {
      min_bh = 4;
      pfVar8 = features;
      pfVar9 = local_2a44;
      for (lVar7 = 0x1f; lVar7 != 0; lVar7 = lVar7 + -1) {
        *pfVar9 = *pfVar8;
        pfVar8 = pfVar8 + (ulong)bVar12 * -2 + 1;
        pfVar9 = pfVar9 + (ulong)bVar12 * -2 + 1;
      }
      av1_ext_part_send_features(ext_part_controller,(aom_partition_features_t *)&min_bh);
      _Var5 = av1_ext_part_get_partition_decision
                        (ext_part_controller,(aom_partition_decision_t *)&score);
      if (_Var5) {
        part_state->terminate_partition_search = local_68;
        return;
      }
    }
    score = 0.0;
    (*av1_nn_predict)(features,pNVar10,1,&score);
    if (score < local_2c2c) {
      part_state->terminate_partition_search = 1;
    }
  }
  return;
}

Assistant:

void av1_ml_early_term_after_split(AV1_COMP *const cpi, MACROBLOCK *const x,
                                   SIMPLE_MOTION_DATA_TREE *const sms_tree,
                                   int64_t best_rd, int64_t part_none_rd,
                                   int64_t part_split_rd,
                                   int64_t *split_block_rd,
                                   PartitionSearchState *part_state) {
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const int mi_row = blk_params->mi_row, mi_col = blk_params->mi_col;
  const BLOCK_SIZE bsize = blk_params->bsize;

  if (best_rd <= 0 || best_rd == INT64_MAX ||
      part_state->terminate_partition_search)
    return;

  const AV1_COMMON *const cm = &cpi->common;
  const int is_480p_or_larger = AOMMIN(cm->width, cm->height) >= 480;
  const NN_CONFIG *nn_config = NULL;
  float thresh = -1e6;
  switch (bsize) {
    case BLOCK_128X128: break;
    case BLOCK_64X64:
      nn_config = &av1_early_term_after_split_nnconfig_64;
      thresh = is_480p_or_larger ? -2.0f : -1.2f;
      break;
    case BLOCK_32X32:
      nn_config = &av1_early_term_after_split_nnconfig_32;
      thresh = is_480p_or_larger ? -2.6f : -2.3f;
      break;
    case BLOCK_16X16:
      nn_config = &av1_early_term_after_split_nnconfig_16;
      thresh = is_480p_or_larger ? -2.0f : -2.4f;
      break;
    case BLOCK_8X8:
      nn_config = &av1_early_term_after_split_nnconfig_8;
      thresh = is_480p_or_larger ? -1.0f : -1.4f;
      break;
    case BLOCK_4X4: break;
    default:
      assert(0 && "Invalid block size in av1_ml_early_term_after_split().");
      break;
  }
  if (!nn_config) return;

  // Use more conservative threshold for level 1.
  if (cpi->sf.part_sf.ml_early_term_after_part_split_level < 2) thresh -= 0.3f;

  const MACROBLOCKD *const xd = &x->e_mbd;
  const int dc_q = av1_dc_quant_QTX(x->qindex, 0, xd->bd) >> (xd->bd - 8);
  const int bs = block_size_wide[bsize];
  int f_idx = 0;
  float features[FEATURES] = { 0.0f };

  features[f_idx++] = log1pf((float)dc_q / 4.0f);
  features[f_idx++] = log1pf((float)best_rd / bs / bs / 1024.0f);

  add_rd_feature(part_none_rd, best_rd, features, &f_idx);
  add_rd_feature(part_split_rd, best_rd, features, &f_idx);

  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    add_rd_feature(split_block_rd[i], best_rd, features, &f_idx);
    int min_bw = MAX_SB_SIZE_LOG2;
    int min_bh = MAX_SB_SIZE_LOG2;
    get_min_bsize(sms_tree->split[i], &min_bw, &min_bh);
    features[f_idx++] = (float)min_bw;
    features[f_idx++] = (float)min_bh;
  }

  simple_motion_search_prune_part_features(cpi, x, sms_tree, mi_row, mi_col,
                                           bsize, NULL,
                                           FEATURE_SMS_PRUNE_PART_FLAG);

  features[f_idx++] = log1pf((float)sms_tree->sms_none_feat[1]);

  features[f_idx++] = log1pf((float)sms_tree->split[0]->sms_none_feat[1]);
  features[f_idx++] = log1pf((float)sms_tree->split[1]->sms_none_feat[1]);
  features[f_idx++] = log1pf((float)sms_tree->split[2]->sms_none_feat[1]);
  features[f_idx++] = log1pf((float)sms_tree->split[3]->sms_none_feat[1]);

  features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[1]);
  features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[3]);
  features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[5]);
  features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[7]);

  assert(f_idx == FEATURES);

  // Write features to file
  write_features_to_file(cpi->oxcf.partition_info_path,
                         cpi->ext_part_controller.test_mode, features, FEATURES,
                         4, bsize, mi_row, mi_col);

  if (ext_ml_model_decision_after_split(
          cpi, features, &part_state->terminate_partition_search)) {
    return;
  }

  float score = 0.0f;
  av1_nn_predict(features, nn_config, 1, &score);
  // Score is indicator of confidence that we should NOT terminate.
  if (score < thresh) {
    part_state->terminate_partition_search = 1;
  }
}